

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O0

dino_route_t * list_add_new_item(dino_route_t **head)

{
  dino_route_t *pdVar1;
  dino_route_struct *pdVar2;
  dino_route_t *local_20;
  dino_route_t *ptr;
  dino_route_t **head_local;
  
  if (head == (dino_route_t **)0x0) {
    head_local = (dino_route_t **)0x0;
  }
  else if (*head == (dino_route_t *)0x0) {
    pdVar1 = (dino_route_t *)memory_alloc(0x30);
    *head = pdVar1;
    head_local = &(*head)->next;
  }
  else {
    for (local_20 = *head; local_20->next != (dino_route_struct *)0x0; local_20 = local_20->next) {
    }
    pdVar2 = (dino_route_struct *)memory_alloc(0x30);
    local_20->next = pdVar2;
    head_local = &local_20->next->next;
  }
  return (dino_route_t *)head_local;
}

Assistant:

dino_route_t *list_add_new_item(dino_route_t **head) {
    // List is invalid.
    //
    if (NULL == head) {
        return NULL;
    }

    // List is empty.
    //
    if (NULL == *head) {
        *head = (dino_route_t *) memory_alloc(sizeof(dino_route_t));
        return *head;
    }

    // Add to the end of the list.
    //
    dino_route_t *ptr = *head;

    while (ptr->next != NULL) { ptr = ptr->next; }

    ptr->next = (dino_route_t *) memory_alloc(sizeof(dino_route_t));

    return ptr->next;
}